

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O1

bool cmDefinitions::HasKey(string *key,StackIter begin,StackIter end)

{
  bool bVar1;
  _Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  iterator iVar2;
  key_type local_68;
  iterator local_40;
  
  local_40.Position = begin.Position;
  local_40.Tree = begin.Tree;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_40,end);
  if (bVar1) {
    do {
      this = (_Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
      local_68.view_._M_str = (key->_M_dataplus)._M_p;
      local_68.view_._M_len = key->_M_string_length;
      local_68.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar2 = std::
              _Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this,&local_68);
      cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
      if (local_68.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.string_.
                   super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (iVar2.super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>.
          _M_cur != (__node_type *)0x0) {
        return bVar1;
      }
      cmLinkedTree<cmDefinitions>::iterator::operator++(&local_40);
      bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_40,end);
    } while (bVar1);
  }
  return bVar1;
}

Assistant:

bool cmDefinitions::HasKey(const std::string& key, StackIter begin,
                           StackIter end)
{
  for (StackIter it = begin; it != end; ++it) {
    if (it->Map.find(cm::String::borrow(key)) != it->Map.end()) {
      return true;
    }
  }
  return false;
}